

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

char * fmt::v10::detail::do_parse_arg_id<char,fmt::v10::detail::dynamic_spec_id_handler<char>&>
                 (char *begin,char *end,dynamic_spec_id_handler<char> *handler)

{
  char c_00;
  basic_string_view<char> id;
  bool bVar1;
  bool bVar2;
  type count;
  size_t in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *it;
  int max;
  int index;
  char c;
  undefined5 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb5;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  int in_stack_ffffffffffffffbc;
  dynamic_spec_id_handler<char> *in_stack_ffffffffffffffc0;
  char **in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined3 in_stack_ffffffffffffffdc;
  undefined4 uVar3;
  char *local_10;
  char *local_8;
  
  c_00 = *in_RDI;
  uVar3 = CONCAT13(c_00,in_stack_ffffffffffffffdc);
  if ((c_00 < '0') || ('9' < c_00)) {
    bVar1 = is_name_start<char>(c_00);
    local_8 = in_RDI;
    if (!bVar1) {
      throw_format_error((char *)CONCAT17(in_stack_ffffffffffffffb7,
                                          CONCAT16(in_stack_ffffffffffffffb6,
                                                   CONCAT15(in_stack_ffffffffffffffb5,
                                                            in_stack_ffffffffffffffb0))));
    }
    do {
      local_8 = local_8 + 1;
      bVar1 = false;
      if (local_8 != in_RSI) {
        bVar2 = is_name_start<char>(*local_8);
        bVar1 = true;
        if ((!bVar2) && (bVar1 = false, '/' < *local_8)) {
          bVar1 = *local_8 < ':';
        }
      }
    } while (bVar1);
    count = to_unsigned<long>(0x284fb0);
    basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)&stack0xffffffffffffffb8,in_RDI,count);
    id.data_._4_4_ = uVar3;
    id.data_._0_4_ = in_stack_ffffffffffffffd8;
    id.size_ = in_RDX;
    dynamic_spec_id_handler<char>::on_name
              ((dynamic_spec_id_handler<char> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),id);
  }
  else {
    if (c_00 == '0') {
      local_10 = in_RDI + 1;
    }
    else {
      parse_nonnegative_int<char>
                (in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffbc);
      local_10 = in_RDI;
    }
    if ((local_10 == in_RSI) || ((*local_10 != '}' && (*local_10 != ':')))) {
      throw_format_error((char *)CONCAT17(in_stack_ffffffffffffffb7,
                                          CONCAT16(in_stack_ffffffffffffffb6,
                                                   CONCAT15(in_stack_ffffffffffffffb5,
                                                            in_stack_ffffffffffffffb0))));
    }
    dynamic_spec_id_handler<char>::on_index(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    local_8 = local_10;
  }
  return local_8;
}

Assistant:

FMT_CONSTEXPR auto do_parse_arg_id(const Char* begin, const Char* end,
                                   Handler&& handler) -> const Char* {
  Char c = *begin;
  if (c >= '0' && c <= '9') {
    int index = 0;
    constexpr int max = (std::numeric_limits<int>::max)();
    if (c != '0')
      index = parse_nonnegative_int(begin, end, max);
    else
      ++begin;
    if (begin == end || (*begin != '}' && *begin != ':'))
      throw_format_error("invalid format string");
    else
      handler.on_index(index);
    return begin;
  }
  if (!is_name_start(c)) {
    throw_format_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(*it) || ('0' <= *it && *it <= '9')));
  handler.on_name({begin, to_unsigned(it - begin)});
  return it;
}